

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall adios2::Engine::PerformGets(Engine *this)

{
  Engine *pointer;
  allocator local_39;
  string local_38;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string((string *)&local_38,"in call to Engine::PerformGets",&local_39);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (**(code **)(*(long *)this->m_Engine + 0x38))();
  return;
}

Assistant:

void Engine::PerformGets()
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::PerformGets");
    m_Engine->PerformGets();
}